

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O2

REF_STATUS ref_inflate_extend_rail(REF_INT *n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  
  uVar8 = *n;
  uVar9 = (ulong)uVar8;
  if (1 < (int)uVar8) {
    uVar11 = (ulong)(uVar8 - 1);
    dVar13 = x[uVar11];
    dVar16 = *x;
    dVar1 = x[1];
    dVar4 = *yz;
    dVar5 = yz[1];
    dVar6 = yz[2];
    dVar7 = yz[3];
    dVar2 = *phi;
    dVar3 = phi[1];
    lVar12 = 0;
    for (; -1 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
      *(REF_DBL *)((long)x + lVar12 * 4 + uVar9 * 8) = x[uVar11];
      iVar10 = (int)lVar12;
      yz[uVar8 * 2 + iVar10] = yz[uVar8 * 2 + -2 + iVar10];
      yz[uVar8 * 2 + 1 + iVar10] = yz[uVar8 * 2 + -1 + iVar10];
      *(REF_DBL *)((long)phi + lVar12 * 4 + uVar9 * 8) = phi[uVar11];
      lVar12 = lVar12 + -2;
    }
    iVar10 = uVar8 + 1;
    *n = iVar10;
    dVar13 = (dVar13 - dVar16) * 0.25;
    *x = x[1] - dVar13;
    dVar16 = dVar13 / (dVar1 - dVar16);
    *yz = yz[2] - dVar16 * (dVar6 - dVar4);
    yz[1] = yz[3] - dVar16 * (dVar7 - dVar5);
    *phi = phi[1] - (dVar3 - dVar2) * dVar16;
    dVar16 = x[uVar9] - x[uVar9 - 1];
    auVar14._0_8_ = dVar16 * 1e+20;
    auVar14._8_8_ = dVar13;
    auVar15._8_8_ = -dVar13;
    auVar15._0_8_ = -auVar14._0_8_;
    auVar15 = maxpd(auVar14,auVar15);
    if (auVar15._8_8_ < auVar15._0_8_) {
      x[uVar9 + 1] = x[uVar9] + dVar13;
      dVar13 = dVar13 / dVar16;
      dVar16 = yz[iVar10 * 2 + -2];
      dVar1 = (yz + (iVar10 * 2 + -2))[1];
      dVar2 = (yz + (iVar10 * 2 + -4))[1];
      yz[iVar10 * 2] = dVar13 * (dVar16 - yz[iVar10 * 2 + -4]) + dVar16;
      (yz + iVar10 * 2)[1] = dVar13 * (dVar1 - dVar2) + dVar1;
      phi[uVar9 + 1] = (phi[uVar9] - phi[uVar9 - 1]) * dVar13 + phi[uVar9];
      uVar8 = uVar8 + 2;
      *n = uVar8;
    }
  }
  return uVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_extend_rail(REF_INT *n, REF_DBL *x,
                                                  REF_DBL *yz, REF_DBL *phi) {
  REF_DBL dx, l, dy, dz, dp;
  REF_INT i;
  if (2 > *n) return REF_SUCCESS;

  l = x[(*n) - 1] - x[0];
  l = 0.25 * l;

  dx = x[1] - x[0];
  dy = yz[0 + 2 * 1] - yz[0 + 2 * 0];
  dz = yz[1 + 2 * 1] - yz[1 + 2 * 0];
  dp = phi[1] - phi[0];

  /* shift to add first node */
  for (i = (*n) - 1; i >= 0; i--) {
    x[i + 1] = x[i];
    yz[0 + 2 * (i + 1)] = yz[0 + 2 * (i)];
    yz[1 + 2 * (i + 1)] = yz[1 + 2 * (i)];
    phi[(i + 1)] = phi[(i)];
  }
  (*n)++;

  x[0] = x[1] - l;
  yz[0 + 2 * 0] = yz[0 + 2 * 1] - dy * (l / dx);
  yz[1 + 2 * 0] = yz[1 + 2 * 1] - dz * (l / dx);
  phi[0] = phi[1] - dp * (l / dx);

  dx = x[(*n) - 1] - x[(*n) - 2];
  if (ref_math_divisible(l, dx)) {
    x[(*n)] = x[(*n) - 1] + l;

    dy = yz[0 + 2 * ((*n) - 1)] - yz[0 + 2 * ((*n) - 2)];
    yz[0 + 2 * (*n)] = yz[0 + 2 * ((*n) - 1)] + dy * (l / dx);

    dz = yz[1 + 2 * ((*n) - 1)] - yz[1 + 2 * ((*n) - 2)];
    yz[1 + 2 * (*n)] = yz[1 + 2 * ((*n) - 1)] + dz * (l / dx);

    dp = phi[((*n) - 1)] - phi[((*n) - 2)];
    phi[(*n)] = phi[((*n) - 1)] + dp * (l / dx);

    (*n)++;
  }
  return REF_SUCCESS;
}